

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_thread.cc
# Opt level: O0

bool __thiscall dd::PlatformThread::SetPriority(PlatformThread *this,ThreadPriority priority)

{
  bool bVar1;
  ThreadPriority priority_local;
  PlatformThread *this_local;
  
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_spawned_thread_checker);
  if (!bVar1) {
    __assert_fail("_spawned_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/platform_thread.cc"
                  ,0x69,"bool dd::PlatformThread::SetPriority(ThreadPriority)");
  }
  return true;
}

Assistant:

bool PlatformThread::SetPriority(ThreadPriority priority)
	{
		assert(_spawned_thread_checker.IsCurrent());
#ifdef _WIN32
		return SetThreadPriority(_thread, priority) != FALSE;
#else
		return true;
#endif
	}